

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

ARMVAParameters
aa64_va_parameters_aarch64(CPUARMState_conflict *env,uint64_t va,ARMMMUIdx mmu_idx,_Bool data)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  TCR *pTVar11;
  bool bVar12;
  
  if (mmu_idx == ARMMMUIdx_Stage2) {
    pTVar11 = &(env->cp15).vtcr_el2;
  }
  else {
    uVar3 = regime_el(env,mmu_idx);
    pTVar11 = (env->cp15).tcr_el + uVar3;
  }
  uVar1 = pTVar11->raw_tcr;
  uVar5 = (ulong)mmu_idx;
  uVar6 = (uint)(uVar1 >> 0x20);
  if ((mmu_idx < 0x23) && ((0x703ef0000U >> (uVar5 & 0x3f) & 1) != 0)) {
    if ((va >> 0x37 & 1) == 0) {
      uVar4 = (uint)((uVar1 & 0xffffffff) >> 7) & 1;
      bVar2 = (bool)((byte)(uVar1 >> 0xe) & 1);
      bVar12 = SUB81((uVar1 & 0xffff) >> 0xf,0);
      uVar7 = uVar6 >> 9 & 1;
      goto LAB_00619efa;
    }
    uVar10 = (uint)(va >> 0x37) & 1;
    uVar4 = (uint)(uVar1 >> 0x1e) & 3;
    bVar12 = uVar4 == 1;
    bVar2 = uVar4 == 3;
    uVar8 = (uint)(uVar1 >> 0x10) & 0xffff;
    uVar4 = (uint)(uVar1 >> 0x17) & 1;
    uVar7 = uVar6 >> 10 & 1;
  }
  else {
    bVar2 = (bool)((byte)(uVar1 >> 0xe) & 1);
    bVar12 = SUB81((uVar1 & 0xffff) >> 0xf,0);
    uVar4 = 0;
    if (mmu_idx == ARMMMUIdx_Stage2) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)(uVar1 >> 0x18) & 1;
      uVar4 = 0;
    }
LAB_00619efa:
    uVar10 = 0;
    uVar8 = (uint)uVar1;
  }
  if (mmu_idx < 0x23) {
    if ((0x703ef0000U >> (uVar5 & 0x3f) & 1) == 0) {
      uVar9 = 0;
      if (uVar5 != 0x1b) goto LAB_00619fe1;
    }
    else {
      uVar9 = uVar6 >> 5;
    }
  }
  else {
LAB_00619fe1:
    uVar9 = ((uint)(uVar1 >> 0x14) & 1) * 3;
  }
  if (data) goto LAB_00619f74;
  if (mmu_idx < 0x23) {
    if ((0x703ef0000U >> (uVar5 & 0x3f) & 1) == 0) {
      uVar6 = 0;
      if (uVar5 != 0x1b) goto LAB_0061a01f;
    }
    else {
      uVar6 = uVar6 >> 0x13;
    }
  }
  else {
LAB_0061a01f:
    uVar6 = ((uint)uVar1 >> 0x1d & 1) * 3;
  }
  uVar9 = uVar9 & ~uVar6;
LAB_00619f74:
  uVar6 = 0x27;
  if ((uVar8 & 0x3f) < 0x27) {
    uVar6 = uVar8 & 0x3f;
  }
  uVar8 = 0x10;
  if (0x10 < uVar6) {
    uVar8 = uVar6;
  }
  return (ARMVAParameters)
         ((uint)bVar2 << 0xd | (uint)bVar12 << 0xc |
         uVar7 << 0xb | uVar4 << 10 | (uint)((uVar9 >> uVar10 & 1) != 0) << 9 | uVar10 << 8 | uVar8)
  ;
}

Assistant:

ARMVAParameters aa64_va_parameters(CPUARMState *env, uint64_t va,
                                   ARMMMUIdx mmu_idx, bool data)
{
    uint64_t tcr = regime_tcr(env, mmu_idx)->raw_tcr;
    bool epd, hpd, using16k, using64k;
    int select, tsz, tbi;

    if (!regime_has_2_ranges(mmu_idx)) {
        select = 0;
        tsz = extract32(tcr, 0, 6);
        using64k = extract32(tcr, 14, 1);
        using16k = extract32(tcr, 15, 1);
        if (mmu_idx == ARMMMUIdx_Stage2) {
            /* VTCR_EL2 */
            hpd = false;
        } else {
            hpd = extract32(tcr, 24, 1);
        }
        epd = false;
    } else {
        /*
         * Bit 55 is always between the two regions, and is canonical for
         * determining if address tagging is enabled.
         */
        select = extract64(va, 55, 1);
        if (!select) {
            tsz = extract32(tcr, 0, 6);
            epd = extract32(tcr, 7, 1);
            using64k = extract32(tcr, 14, 1);
            using16k = extract32(tcr, 15, 1);
            hpd = extract64(tcr, 41, 1);
        } else {
            int tg = extract32(tcr, 30, 2);
            using16k = tg == 1;
            using64k = tg == 3;
            tsz = extract32(tcr, 16, 6);
            epd = extract32(tcr, 23, 1);
            hpd = extract64(tcr, 42, 1);
        }
    }
    tsz = MIN(tsz, 39);  /* TODO: ARMv8.4-TTST */
    tsz = MAX(tsz, 16);  /* TODO: ARMv8.2-LVA  */

    /* Present TBI as a composite with TBID.  */
    tbi = aa64_va_parameter_tbi(tcr, mmu_idx);
    if (!data) {
        tbi &= ~aa64_va_parameter_tbid(tcr, mmu_idx);
    }
    tbi = (tbi >> select) & 1;

    return (ARMVAParameters) {
        .tsz = tsz,
        .select = select,
        .tbi = tbi,
        .epd = epd,
        .hpd = hpd,
        .using16k = using16k,
        .using64k = using64k,
    };
}